

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

bool __thiscall MT32Emu::Synth::isActive(Synth *this)

{
  bool bVar1;
  uint uVar2;
  Synth *this_local;
  
  if ((this->opened & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = MidiEventQueue::isEmpty(this->midiQueue);
    if ((!bVar1) || (bVar1 = hasActivePartials(this), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = isReverbEnabled(this);
      if ((bVar1) && (uVar2 = (*this->reverbModel->_vptr_BReverbModel[7])(), (uVar2 & 1) != 0)) {
        this_local._7_1_ = true;
      }
      else {
        this->activated = false;
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Synth::isActive() {
	if (!opened) {
		return false;
	}
	if (!midiQueue->isEmpty() || hasActivePartials()) {
		return true;
	}
	if (isReverbEnabled() && reverbModel->isActive()) {
		return true;
	}
	activated = false;
	return false;
}